

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O2

GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *
__thiscall
rapidjson::
GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
PushBack(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         *this,GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *value,MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator)

{
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar1;
  uint uVar2;
  Member *pMVar3;
  undefined8 uVar4;
  uint uVar5;
  SizeType newCapacity;
  
  if (this->flags_ == 4) {
    uVar5 = (this->data_).s.length;
    uVar2 = (this->data_).s.hashcode;
    if (uVar2 <= uVar5) {
      newCapacity = 0x10;
      if (uVar2 != 0) {
        newCapacity = (uVar2 + 1 >> 1) + uVar2;
      }
      Reserve(this,newCapacity,allocator);
      uVar5 = (this->data_).s.length;
    }
    pMVar3 = (this->data_).o.members;
    (this->data_).s.length = uVar5 + 1;
    uVar4 = *(undefined8 *)((long)&value->data_ + 8);
    pGVar1 = &pMVar3->name + uVar5;
    (pGVar1->data_).s.str = (value->data_).s.str;
    *(undefined8 *)((long)&pGVar1->data_ + 8) = uVar4;
    (&pMVar3->name)[uVar5].flags_ = value->flags_;
    value->flags_ = 0;
    return this;
  }
  __assert_fail("IsArray()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ntrrgc[P]pulse-volume-monitor/vendor/rapidjson/document.h"
                ,0x510,
                "GenericValue<Encoding, Allocator> &rapidjson::GenericValue<rapidjson::UTF8<>>::PushBack(GenericValue<Encoding, Allocator> &, Allocator &) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
               );
}

Assistant:

bool IsArray()  const { return flags_ == kArrayFlag; }